

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void ignore_comment(char *line)

{
  char *local_20;
  char *cp2;
  char *cp1;
  char *line_local;
  
  cp2 = strstr(line,"/*");
  if (cp2 != (char *)0x0) {
    local_20 = strstr(cp2,"*/");
    if (local_20 == (char *)0x0) {
      vrna_message_error("unclosed comment in parameter file");
    }
    for (local_20 = local_20 + 2; *local_20 != '\0'; local_20 = local_20 + 1) {
      *cp2 = *local_20;
      cp2 = cp2 + 1;
    }
    *cp2 = '\0';
  }
  return;
}

Assistant:

PRIVATE void
ignore_comment(char *line)
{
  /*
   * excise C style comments
   * only one comment per line, no multiline comments
   */
  char *cp1, *cp2;

  if ((cp1 = strstr(line, "/*"))) {
    cp2 = strstr(cp1, "*/");
    if (cp2 == NULL)
      vrna_message_error("unclosed comment in parameter file");

    /* can't use strcpy for overlapping strings */
    for (cp2 += 2; *cp2 != '\0'; cp2++, cp1++)
      *cp1 = *cp2;
    *cp1 = '\0';
  }

  return;
}